

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to16.h
# Opt level: O0

void ncnn::convolution_im2col_sgemm_pack8to16_avx512
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,int kernel_w,int kernel_h,
               int dilation_w,int dilation_h,int stride_w,int stride_h,Option *opt)

{
  long in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  undefined4 in_stack_0000002c;
  __m256 _val;
  int j;
  int i;
  float *sptr;
  int v;
  int u;
  float *ptr;
  Mat img;
  int p;
  int gap;
  Mat bottom_im2col;
  int maxk;
  int size;
  int outh;
  int outw;
  int inch;
  int w;
  Mat *m_1;
  Mat *m;
  Option *in_stack_00000930;
  Mat *in_stack_00000938;
  Mat *in_stack_00000940;
  Mat *in_stack_00000948;
  Mat *in_stack_00000950;
  int in_stack_fffffffffffffb9c;
  size_t in_stack_fffffffffffffba0;
  void **ppvVar1;
  undefined8 in_stack_fffffffffffffba8;
  undefined8 in_stack_fffffffffffffbb0;
  Mat *in_stack_fffffffffffffbb8;
  Allocator *in_stack_fffffffffffffc18;
  int local_3d0;
  int local_3cc;
  undefined8 *local_3c8;
  int local_3c0;
  int local_3bc;
  undefined8 local_3b8;
  undefined8 local_3b0;
  undefined8 local_3a8;
  undefined4 local_3a0;
  long *local_398;
  undefined4 local_390;
  undefined4 local_38c;
  undefined4 local_388;
  undefined4 local_384;
  undefined4 local_380;
  undefined8 local_378;
  undefined8 *local_370;
  undefined8 local_358;
  undefined8 local_350;
  undefined8 local_348;
  undefined4 local_340;
  long local_338;
  undefined4 local_330;
  undefined4 local_32c;
  undefined4 local_328;
  undefined4 local_324;
  undefined4 local_320;
  undefined8 local_318;
  int local_310;
  int local_30c;
  void *local_308;
  int *local_300;
  long local_2f8;
  undefined4 local_2f0;
  long *local_2e8;
  undefined4 local_2e0;
  int local_2dc;
  int local_2d8;
  undefined4 local_2d4;
  undefined4 local_2d0;
  long local_2c8;
  int local_2c0;
  int local_2bc;
  int local_2b8;
  int local_2b4;
  int local_2b0;
  int local_2ac;
  int local_2a8;
  int local_2a4;
  long *local_288;
  undefined8 *local_280;
  undefined8 *local_270;
  void **local_260;
  int local_240;
  undefined4 local_23c;
  void **local_238;
  undefined8 *local_218;
  undefined8 *local_1f8;
  undefined1 local_1ed;
  int local_1ec;
  void **local_1e8;
  undefined8 *local_1e0;
  undefined8 *local_1c0;
  int local_1b4;
  undefined8 *local_1b0;
  undefined1 local_1a5;
  int local_1a4;
  undefined8 *local_198;
  void *local_148;
  undefined8 local_138;
  undefined4 local_12c;
  undefined8 local_128;
  int local_11c;
  int local_118;
  int local_114;
  void **local_110;
  undefined8 *local_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 *local_c8;
  long local_c0;
  undefined4 local_b4;
  long local_b0;
  long local_a8;
  undefined4 local_9c;
  int local_98;
  int local_94;
  undefined8 *local_90;
  long *local_88;
  undefined4 local_7c;
  long local_78;
  undefined8 *local_70;
  undefined4 local_64;
  int local_60;
  int local_5c;
  undefined8 *local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  long local_38;
  
  local_2ac = *(int *)((long)in_RDI + 0x2c);
  local_2b0 = (int)in_RDI[7];
  local_2b4 = *(int *)(in_RSI + 0x2c);
  local_2b8 = *(int *)(in_RSI + 0x30);
  local_2bc = local_2b4 * local_2b8;
  local_2c0 = in_R8D * in_R9D;
  local_138 = *(undefined8 *)(CONCAT44(in_stack_0000002c,stride_h) + 0x10);
  local_110 = &local_308;
  local_128 = 0x20;
  local_12c = 8;
  local_308 = (void *)0x0;
  local_300 = (int *)0x0;
  local_2f8 = 0;
  local_2f0 = 0;
  local_2e8 = (long *)0x0;
  local_2e0 = 0;
  local_2dc = 0;
  local_2d8 = 0;
  local_2d4 = 0;
  local_2d0 = 0;
  local_2c8 = 0;
  local_2a8 = in_R9D;
  local_2a4 = in_R8D;
  local_288 = in_RDI;
  local_11c = local_2b0;
  local_118 = local_2c0;
  local_114 = local_2bc;
  Mat::create(in_stack_fffffffffffffbb8,(int)((ulong)in_stack_fffffffffffffbb0 >> 0x20),
              (int)in_stack_fffffffffffffbb0,(int)((ulong)in_stack_fffffffffffffba8 >> 0x20),
              in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,in_stack_fffffffffffffc18);
  local_30c = (local_2ac * stride_w - local_2b4 * dilation_h) * 8;
  for (local_310 = 0; local_310 < local_2b0; local_310 = local_310 + 1) {
    local_198 = &local_358;
    local_94 = *(int *)((long)local_288 + 0x2c);
    local_98 = (int)local_288[6];
    local_9c = *(undefined4 *)((long)local_288 + 0x34);
    local_a8 = *local_288 + local_288[8] * (long)local_310 * local_288[2];
    local_b0 = local_288[2];
    local_b4 = (undefined4)local_288[3];
    local_c0 = local_288[4];
    local_90 = &local_358;
    local_38 = (long)local_94 * (long)local_98 * local_b0;
    local_1e0 = &local_3b8;
    local_1e8 = &local_308;
    local_70 = (undefined8 *)((long)local_308 + local_2c8 * local_310 * local_2f8);
    local_58 = &local_3b8;
    local_48 = (long)local_2dc * (long)local_2d8 * local_2f8;
    local_1c0 = &local_3b8;
    local_280 = &local_3b8;
    local_398 = local_2e8;
    local_3b8 = 0;
    local_3a8 = 0;
    local_3a0 = 0;
    local_390 = 0;
    local_38c = 0;
    local_388 = 0;
    local_384 = 0;
    local_380 = 0;
    local_378 = 0;
    local_3b0 = 0;
    local_370 = local_70;
    for (local_3bc = 0; local_3bc < local_2a8; local_3bc = local_3bc + 1) {
      for (local_3c0 = 0; local_3c0 < local_2a4; local_3c0 = local_3c0 + 1) {
        local_1b4 = dilation_w * local_3bc;
        local_1b0 = &local_358;
        local_3c8 = (undefined8 *)
                    (local_a8 + (long)local_94 * (long)local_1b4 * local_b0 +
                    (long)(in_stack_00000008 * local_3c0 * 8) * 4);
        for (local_3cc = 0; local_3cc < local_2b8; local_3cc = local_3cc + 1) {
          for (local_3d0 = 0; local_3d0 < local_2b4; local_3d0 = local_3d0 + 1) {
            local_108 = local_3c8;
            local_100 = *local_3c8;
            uStack_f8 = local_3c8[1];
            uStack_f0 = local_3c8[2];
            uStack_e8 = local_3c8[3];
            local_c8 = local_370;
            *local_370 = local_100;
            local_370[1] = uStack_f8;
            local_370[2] = uStack_f0;
            local_370[3] = uStack_e8;
            local_3c8 = (undefined8 *)((long)local_3c8 + (long)(dilation_h << 3) * 4);
            local_370 = local_370 + 4;
          }
          local_3c8 = (undefined8 *)((long)local_3c8 + (long)local_30c * 4);
        }
      }
    }
    local_270 = &local_358;
    local_3c = 0x10;
    local_4c = 0x10;
    local_5c = local_2dc;
    local_60 = local_2d8;
    local_64 = local_2d4;
    local_78 = local_2f8;
    local_7c = local_2f0;
    local_88 = local_2e8;
    local_1a4 = local_310;
    local_1a5 = 1;
    local_1ec = local_310;
    local_1ed = 1;
    local_358 = 0;
    local_348 = 0;
    local_340 = 0;
    local_330 = 0;
    local_32c = 0;
    local_328 = 0;
    local_324 = 0;
    local_320 = 0;
    local_318 = 0;
    local_350 = 0;
    local_218 = local_270;
    local_1f8 = local_280;
    local_338 = local_c0;
  }
  im2col_sgemm_pack8to16_avx512
            (in_stack_00000950,in_stack_00000948,in_stack_00000940,in_stack_00000938,
             in_stack_00000930);
  ppvVar1 = &local_308;
  if (local_300 != (int *)0x0) {
    local_23c = 0xffffffff;
    LOCK();
    local_240 = *local_300;
    *local_300 = *local_300 + -1;
    UNLOCK();
    if (local_240 == 1) {
      local_260 = ppvVar1;
      local_238 = ppvVar1;
      if (local_2e8 == (long *)0x0) {
        local_148 = local_308;
        if (local_308 != (void *)0x0) {
          free(local_308);
        }
      }
      else {
        (**(code **)(*local_2e8 + 0x18))(local_2e8,local_308);
      }
    }
  }
  *ppvVar1 = (void *)0x0;
  ppvVar1[2] = (void *)0x0;
  *(undefined4 *)(ppvVar1 + 3) = 0;
  *(undefined4 *)(ppvVar1 + 5) = 0;
  *(undefined4 *)((long)ppvVar1 + 0x2c) = 0;
  *(undefined4 *)(ppvVar1 + 6) = 0;
  *(undefined4 *)((long)ppvVar1 + 0x34) = 0;
  *(undefined4 *)(ppvVar1 + 7) = 0;
  ppvVar1[8] = (void *)0x0;
  ppvVar1[1] = (void *)0x0;
  return;
}

Assistant:

static void convolution_im2col_sgemm_pack8to16_avx512(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    const int size = outw * outh;

    const int maxk = kernel_w * kernel_h;

    // im2col
    Mat bottom_im2col(size, maxk, inch, 32u, 8, opt.workspace_allocator);
    {
        const int gap = (w * stride_h - outw * stride_w) * 8;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < inch; p++)
        {
            const Mat img = bottom_blob.channel(p);
            float* ptr = bottom_im2col.channel(p);

            for (int u = 0; u < kernel_h; u++)
            {
                for (int v = 0; v < kernel_w; v++)
                {
                    const float* sptr = img.row(dilation_h * u) + dilation_w * v * 8;

                    for (int i = 0; i < outh; i++)
                    {
                        int j = 0;
                        for (; j < outw; j++)
                        {
                            __m256 _val = _mm256_load_ps(sptr);
                            _mm256_store_ps(ptr, _val);

                            sptr += stride_w * 8;
                            ptr += 8;
                        }

                        sptr += gap;
                    }
                }
            }
        }
    }

    im2col_sgemm_pack8to16_avx512(bottom_im2col, top_blob, kernel, _bias, opt);
}